

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O2

Maj_Man_t * Maj_ManAlloc(int nVars,int nNodes,int fUseConst,int fUseLine)

{
  int iVar1;
  Maj_Man_t *p;
  Vec_Wec_t *pVVar2;
  Vec_Wrd_t *pVVar3;
  bmcg_sat_solver *s;
  int nSize;
  
  p = (Maj_Man_t *)calloc(1,0x30c0);
  p->nVars = nVars;
  p->nNodes = nNodes;
  nSize = nVars + nNodes + 2;
  p->nObjs = nSize;
  p->fUseConst = fUseConst;
  p->fUseLine = fUseLine;
  iVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar1 = 1;
  }
  p->nWords = iVar1;
  pVVar2 = Vec_WecStart(nSize);
  p->vOutLits = pVVar2;
  iVar1 = Maj_ManMarkup(p);
  p->iVar = iVar1;
  p->VarVals[1] = 1;
  pVVar3 = Maj_ManTruthTables(p);
  p->vInfo = pVVar3;
  s = bmcg_sat_solver_start();
  p->pSat = s;
  bmcg_sat_solver_set_nvars(s,p->iVar);
  return p;
}

Assistant:

Maj_Man_t * Maj_ManAlloc( int nVars, int nNodes, int fUseConst, int fUseLine )
{
    Maj_Man_t * p = ABC_CALLOC( Maj_Man_t, 1 );
    p->nVars      = nVars;
    p->nNodes     = nNodes;
    p->nObjs      = 2 + nVars + nNodes;
    p->fUseConst  = fUseConst;
    p->fUseLine   = fUseLine;
    p->nWords     = Abc_TtWordNum(nVars);
    p->vOutLits   = Vec_WecStart( p->nObjs );
    p->iVar       = Maj_ManMarkup( p );
    p->VarVals[1] = 1;
    p->vInfo      = Maj_ManTruthTables( p );
    p->pSat       = bmcg_sat_solver_start();
    bmcg_sat_solver_set_nvars( p->pSat, p->iVar );
    return p;
}